

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTableInit
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name elem,Name table)

{
  Name table_00;
  Name segment;
  TableInit *pTVar1;
  bool bVar2;
  Ok local_109;
  IRBuilder *local_108;
  size_t local_100;
  char *local_f8;
  char *local_f0;
  uint local_e4;
  Err local_e0;
  Err *local_b0;
  Err *err;
  Result<wasm::Ok> _val;
  TableInit curr;
  IRBuilder *this_local;
  Name table_local;
  Name elem_local;
  
  table_local.super_IString.str._M_len = table.super_IString.str._M_str;
  this_local = table.super_IString.str._M_len;
  table_local.super_IString.str._M_str = elem.super_IString.str._M_len;
  pTVar1 = (TableInit *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.table.super_IString.str._M_str = (char *)this;
  TableInit::TableInit(pTVar1);
  wasm::Name::operator=((Name *)&curr.size,(Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitTableInit
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar1);
  local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_b0 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_e0,local_b0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  local_e4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_e4 == 0) {
    local_f8 = table_local.super_IString.str._M_str;
    local_108 = this_local;
    local_100 = table_local.super_IString.str._M_len;
    segment.super_IString.str._M_str = elem.super_IString.str._M_str;
    segment.super_IString.str._M_len = (size_t)table_local.super_IString.str._M_str;
    table_00.super_IString.str._M_str = (char *)table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_len = (size_t)this_local;
    local_f0 = elem.super_IString.str._M_str;
    pTVar1 = Builder::makeTableInit
                       (&this->builder,segment,(Expression *)curr.segment.super_IString.str._M_str,
                        curr.dest,curr.offset,table_00);
    push(this,(Expression *)pTVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTableInit(Name elem, Name table) {
  TableInit curr;
  curr.table = table;
  CHECK_ERR(visitTableInit(&curr));
  push(builder.makeTableInit(elem, curr.dest, curr.offset, curr.size, table));
  return Ok{};
}